

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

uchar mbedtls_ssl_sig_from_pk_alg(mbedtls_pk_type_t type)

{
  undefined1 local_9;
  mbedtls_pk_type_t type_local;
  
  if (type == MBEDTLS_PK_RSA) {
    local_9 = '\x01';
  }
  else if ((type == MBEDTLS_PK_ECKEY) || (type == MBEDTLS_PK_ECDSA)) {
    local_9 = '\x03';
  }
  else {
    local_9 = '\0';
  }
  return local_9;
}

Assistant:

unsigned char mbedtls_ssl_sig_from_pk_alg(mbedtls_pk_type_t type)
{
    switch (type) {
        case MBEDTLS_PK_RSA:
            return MBEDTLS_SSL_SIG_RSA;
        case MBEDTLS_PK_ECDSA:
        case MBEDTLS_PK_ECKEY:
            return MBEDTLS_SSL_SIG_ECDSA;
        default:
            return MBEDTLS_SSL_SIG_ANON;
    }
}